

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O2

U64 __thiscall USBPacket::AddRawByteFrames(USBPacket *this,USBAnalyzerResults *pResults)

{
  pointer puVar1;
  pointer puVar2;
  U64 UVar3;
  ulong uVar4;
  long lVar5;
  unsigned_long_long local_b8;
  U64 local_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  string bytes_row;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Frame::Frame((Frame *)&local_b8);
  local_98 = 0xb;
  uStack_a0 = 0;
  bytes_row._M_dataplus._M_p = (pointer)&bytes_row.field_2;
  bytes_row._M_string_length = 0;
  bytes_row.field_2._M_local_buf[0] = '\0';
  lVar5 = 0x40;
  for (uVar4 = 0;
      puVar1 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->mData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
      uVar4 = uVar4 + 1) {
    int2str_sal_abi_cxx11_(&local_70,(ulong)puVar1[uVar4],Hexadecimal,8);
    std::operator+(&local_50,&local_70,", ");
    std::__cxx11::string::append((string *)&bytes_row);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    puVar2 = (this->mBitBeginSamples).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8 = *(undefined8 *)((long)puVar2 + lVar5 + -0x40);
    local_b0 = *(undefined8 *)((long)puVar2 + lVar5);
    local_a8 = (ulong)(this->mData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4];
    lVar5 = lVar5 + 0x40;
    AnalyzerResults::AddFrame((Frame *)pResults);
  }
  local_b8 = (this->mBitBeginSamples).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  local_b0 = this->mSampleEnd;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 5;
  AnalyzerResults::AddFrame((Frame *)pResults);
  AnalyzerResults::CommitResults();
  UVar3 = local_b0;
  std::__cxx11::string::~string((string *)&bytes_row);
  Frame::~Frame((Frame *)&local_b8);
  return UVar3;
}

Assistant:

U64 USBPacket::AddRawByteFrames( USBAnalyzerResults* pResults )
{
    // raw data
    size_t bc;
    Frame f;
    f.mType = FT_Byte;
    f.mData2 = 0;
    f.mFlags = FF_None;
    std::string bytes_row;
    for( bc = 0; bc < mData.size(); ++bc )
    {
        bytes_row += int2str_sal( mData[ bc ], Hexadecimal, 8 ) + ", ";

        f.mStartingSampleInclusive = *( mBitBeginSamples.begin() + bc * 8 );
        f.mEndingSampleInclusive = *( mBitBeginSamples.begin() + ( bc + 1 ) * 8 );
        f.mData1 = mData[ bc ];
        pResults->AddFrame( f );
    }

    // add the EOP frame
    f.mStartingSampleInclusive = mBitBeginSamples.back();
    // EOP is 2 bits SE0 and one bit J, so add another bit
    f.mEndingSampleInclusive = mSampleEnd;
    f.mData1 = f.mData2 = 0;
    f.mFlags = FF_None;
    f.mType = FT_EOP;
    pResults->AddFrame( f );

    pResults->CommitResults();

    return f.mEndingSampleInclusive;
}